

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

TreePattern * __thiscall IRT::TreePattern::GetStringRepresentation_abi_cxx11_(TreePattern *this)

{
  long in_RSI;
  TreePattern *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x18));
  return this;
}

Assistant:

std::string IRT::TreePattern::GetStringRepresentation( ) {
    return stringRepresentation;
}